

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructVerifier
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  pointer ppFVar1;
  string asStack_250 [32];
  string sStack_230;
  CodeWriter CStack_210;
  
  if (((struct_def->super_Definition).generated == false) && (struct_def->fixed == false)) {
    sStack_230._M_dataplus._M_p = (pointer)&sStack_230.field_2;
    sStack_230._M_string_length = 0;
    sStack_230.field_2._M_local_buf[0] = '\0';
    CodeWriter::CodeWriter(&CStack_210,&sStack_230);
    std::__cxx11::string::~string((string *)&sStack_230);
    GetStartOfTableVerifier(this,struct_def,code_ptr);
    for (ppFVar1 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
      if ((*ppFVar1)->deprecated == false) {
        GenVerifyCall(this,&CStack_210,*ppFVar1,"");
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string(asStack_250);
    GetEndOfTableVerifier(this,code_ptr);
    CodeWriter::~CodeWriter(&CStack_210);
    return;
  }
  return;
}

Assistant:

void GenStructVerifier(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    // cur_name_space_ = struct_def.defined_namespace;

    // Generate verifiers
    if (struct_def.fixed) {
      // Fixed size structures do not require table members
      // verification - instead structure size is verified using VerifyField
    } else {
      // Create table verification function
      GenTableVerifier(struct_def, code_ptr);
    }
  }